

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

usize __thiscall
Console::Prompt::Private::readUnbufferedEscapedSequence(Private *this,char *seqStart,char *buffer)

{
  code *pcVar1;
  int iVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  usize uVar4;
  char ch;
  undefined8 uStack_38;
  
  uVar4 = 1;
  uStack_38 = in_RAX;
  while( true ) {
    sVar3 = read(0,(void *)((long)&uStack_38 + 7),1);
    if (sVar3 != 1) {
      iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                            ,0x47d,"read(STDIN_FILENO, &ch, 1) == 1");
      if (iVar2 != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    buffer[uVar4 - 1] = uStack_38._7_1_;
    if ((seqStart[1] != '[') ||
       ((9 < (int)(char)uStack_38._7_1_ - 0x30U &&
        ((0x20 < uStack_38._7_1_ - 0x3b ||
         ((0x100000011U >> ((ulong)(uStack_38._7_1_ - 0x3b) & 0x3f) & 1) == 0)))))) break;
    uVar4 = uVar4 + 1;
  }
  buffer[uVar4] = '\0';
  return uVar4;
}

Assistant:

usize readUnbufferedEscapedSequence(const char* seqStart, char* buffer)
  {
    for(char* start = buffer, ch;;)
    {
      VERIFY(read(STDIN_FILENO, &ch, 1) == 1);
      *(buffer++) = ch;
      if(seqStart[1] != '[' || !isSeqAttributeChar(ch))
      {
        *buffer = '\0';
        return buffer - start;
      }
    }
  }